

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_find(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int findIndex)

{
  uint uVar1;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar5;
  JSValueUnion JVar6;
  ulong uVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue v;
  JSValue JVar10;
  JSValue this_obj;
  int64_t local_98;
  JSValueUnion local_80;
  JSValue local_68;
  ulong local_58;
  undefined8 local_50;
  JSValueUnion local_48;
  int64_t local_40;
  int64_t iVar4;
  
  uVar1 = js_typed_array_get_length_internal(ctx,this_val);
  iVar4 = 3;
  if (-1 < (int)uVar1) {
    JVar8 = *argv;
    iVar2 = check_function(ctx,*argv);
    if (iVar2 == 0) {
      if (argc < 2) {
        local_98 = 3;
        local_80.float64 = 0.0;
      }
      else {
        local_80 = (JSValueUnion)argv[1].u.ptr;
        local_98 = argv[1].tag;
      }
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        JVar10.tag = 0;
        JVar10.u.ptr = (void *)uVar5;
        v = JS_GetPropertyValue(ctx,this_val,JVar10);
        iVar4 = v.tag;
        JVar3 = v.u;
        if ((int)v.tag == 6) {
LAB_0015bf81:
          uVar5 = (ulong)JVar3.ptr & 0xffffffff00000000;
          uVar7 = (ulong)JVar3.ptr & 0xffffffff;
          goto LAB_0015be71;
        }
        local_50 = 0;
        this_obj.tag = local_98;
        this_obj.u.float64 = local_80.float64;
        local_68 = v;
        local_58 = uVar5;
        local_48 = this_val.u;
        local_40 = this_val.tag;
        JVar10 = JS_Call(ctx,JVar8,this_obj,3,&local_68);
        if ((int)JVar10.tag == 6) goto LAB_0015bf81;
        iVar2 = JS_ToBoolFree(ctx,JVar10);
        if (iVar2 != 0) {
          if (findIndex == 0) {
            JVar3.float64 = JVar3.float64 & 0xffffffff00000000;
          }
          else {
            JS_FreeValue(ctx,v);
            JVar3.float64 = 0.0;
            v.tag = 0;
            v.u.ptr = (void *)uVar5;
          }
          goto LAB_0015be87;
        }
        JS_FreeValue(ctx,v);
      }
      JVar3.float64 = 0.0;
      JVar6.float64 = 2.12199579047121e-314;
      if (findIndex == 0) {
        JVar6.float64 = JVar3.float64;
      }
      v.tag = (ulong)(findIndex == 0) * 3;
      v.u.float64 = JVar6.float64;
      goto LAB_0015be87;
    }
  }
  uVar7 = 0;
  uVar5 = 0;
LAB_0015be71:
  JVar8.u.ptr = (void *)(uVar7 | uVar5);
  JVar8.tag = iVar4;
  JS_FreeValue(ctx,JVar8);
  v = (JSValue)(ZEXT816(6) << 0x40);
  JVar3.float64 = 0.0;
LAB_0015be87:
  JVar9.u.float64 = (ulong)v.u.ptr & 0xffffffff | JVar3.float64;
  JVar9.tag = v.tag;
  return JVar9;
}

Assistant:

static JSValue js_typed_array_find(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int findIndex)
{
    JSValueConst func, this_arg;
    JSValueConst args[3];
    JSValue val, index_val, res;
    int len, k;

    val = JS_UNDEFINED;
    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        goto exception;

    func = argv[0];
    if (check_function(ctx, func))
        goto exception;

    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];

    for(k = 0; k < len; k++) {
        index_val = JS_NewInt32(ctx, k);
        val = JS_GetPropertyValue(ctx, this_val, index_val);
        if (JS_IsException(val))
            goto exception;
        args[0] = val;
        args[1] = index_val;
        args[2] = this_val;
        res = JS_Call(ctx, func, this_arg, 3, args);
        if (JS_IsException(res))
            goto exception;
        if (JS_ToBoolFree(ctx, res)) {
            if (findIndex) {
                JS_FreeValue(ctx, val);
                return index_val;
            } else {
                return val;
            }
        }
        JS_FreeValue(ctx, val);
    }
    if (findIndex)
        return JS_NewInt32(ctx, -1);
    else
        return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}